

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  char cVar1;
  int iVar2;
  VarStatus VVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Nonzero<double> *pNVar7;
  VarStatus *pVVar8;
  pointer pdVar9;
  long lVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar12;
  
  iVar2 = this->m_k;
  pVVar8 = cStatus->data;
  VVar3 = pVVar8[iVar2];
  if (VVar3 == ON_UPPER) {
    cVar1 = this->m_strictUp;
joined_r0x001fd2a1:
    if (cVar1 == '\0') {
      return;
    }
  }
  else {
    if (VVar3 != FIXED) {
      if (VVar3 != ON_LOWER) {
        return;
      }
LAB_001fd264:
      cVar1 = this->m_strictLo;
      goto joined_r0x001fd2a1;
    }
    dVar11 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_j];
    if (this->m_maxSense == true) {
      if ((dVar11 <= 0.0) || (this->m_strictUp == false)) {
        if (0.0 <= dVar11) {
          return;
        }
        goto LAB_001fd264;
      }
    }
    else if ((dVar11 <= 0.0) || (this->m_strictLo == false)) {
      if (0.0 <= dVar11) {
        return;
      }
      if (this->m_strictUp != true) {
        return;
      }
    }
  }
  dVar11 = this->m_kObj;
  iVar4 = this->m_i;
  pNVar7 = (this->m_col).super_SVectorBase<double>.m_elem;
  uVar5 = (this->m_col).super_SVectorBase<double>.memused;
  dVar12 = 0.0;
  if (pNVar7 != (Nonzero<double> *)0x0) {
    if ((int)uVar5 < 1) {
      pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001fd34a;
    }
    lVar10 = 0;
    do {
      if (*(int *)((long)&pNVar7->idx + lVar10) == iVar4) {
        dVar12 = *(double *)((long)&pNVar7->val + lVar10);
        break;
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar10);
  }
  pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)uVar5) {
    lVar10 = 0;
    do {
      iVar6 = *(int *)((long)&pNVar7->idx + lVar10);
      if (iVar6 != iVar4) {
        dVar11 = dVar11 - *(double *)((long)&pNVar7->val + lVar10) * pdVar9[iVar6];
      }
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar10);
  }
LAB_001fd34a:
  pdVar9[iVar4] = dVar11 / dVar12;
  pdVar9 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9[iVar2] = 0.0;
  dVar11 = this->m_jObj - (dVar11 * this->m_aij) / dVar12;
  iVar2 = this->m_j;
  pdVar9[iVar2] = dVar11;
  if (this->m_jFixed == false) {
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if ((extraout_XMM0_Qa < dVar11) ||
       ((dVar11 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_j],
        (*(this->super_PostStep)._vptr_PostStep[7])(this), ABS(dVar11) <= extraout_XMM0_Qa_00 &&
        (dVar11 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_j], dVar12 = this->m_Lo_j,
        (*(this->super_PostStep)._vptr_PostStep[7])(this),
        ABS(dVar11 - dVar12) <= extraout_XMM0_Qa_01)))) {
      pVVar8 = cStatus->data;
      pVVar8[this->m_j] = ON_LOWER;
    }
    else {
      pVVar8 = cStatus->data;
      pVVar8[this->m_j] = ON_UPPER;
    }
  }
  else {
    pVVar8[iVar2] = FIXED;
  }
  pVVar8[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}